

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugAddr.cpp
# Opt level: O2

Error __thiscall
llvm::DWARFDebugAddrTable::extract
          (DWARFDebugAddrTable *this,DWARFDataExtractor Data,uint64_t *OffsetPtr,uint16_t Version,
          uint8_t AddrSize,function<void_(llvm::Error)> *WarnCallback)

{
  byte bVar1;
  ulong uVar2;
  byte bVar3;
  ushort uVar4;
  unsigned_long *Vals_2;
  DWARFDebugAddrTable *pDVar5;
  uint8_t uVar6;
  uint16_t uVar7;
  uint32_t uVar8;
  char *pcVar9;
  uint uVar10;
  undefined7 in_register_00000009;
  char *Vals;
  undefined6 in_register_00000012;
  uint64_t *offset_ptr;
  uint32_t I;
  uint uVar11;
  function<void_(llvm::Error)> *in_R9;
  error_code EC;
  error_code EC_00;
  error_code EC_01;
  error_code EC_02;
  error_code EC_03;
  error_code EC_04;
  error_code EC_05;
  error_code EC_06;
  error_code EC_07;
  error_code EC_08;
  Error local_68;
  unsigned_long *local_60;
  ulong local_58;
  uint32_t TmpLength;
  ushort local_42;
  DWARFDebugAddrTable *pDStack_40;
  uint16_t UnitVersion;
  byte local_31;
  uint8_t AddrSize_local;
  
  offset_ptr = (uint64_t *)CONCAT62(in_register_00000012,Version);
  bVar3 = (byte)WarnCallback;
  uVar4 = (ushort)CONCAT71(in_register_00000009,AddrSize);
  pDStack_40 = this;
  local_31 = bVar3;
  clear((DWARFDebugAddrTable *)OffsetPtr);
  uVar2 = *offset_ptr;
  OffsetPtr[1] = uVar2;
  if ((0xfffffffffffffffb < uVar2) || (Data.super_DataExtractor.Data.Length <= uVar2 + 3)) {
    pcVar9 = (char *)std::_V2::generic_category();
    pDVar5 = pDStack_40;
    EC._M_cat = (error_category *)0x16;
    EC._0_8_ = pDStack_40;
    createStringError<unsigned_long>
              (EC,pcVar9,
               (unsigned_long *)
               "section is not large enough to contain a .debug_addr table length at offset 0x%lx");
    return (Error)(ErrorInfoBase *)pDVar5;
  }
  _TmpLength = OffsetPtr + 1;
  if (uVar4 == 0) {
    pcVar9 = (char *)std::_V2::generic_category();
    EC_00._M_cat = (error_category *)0x16;
    EC_00._0_8_ = &local_68;
    createStringError(EC_00,pcVar9);
    std::function<void_(llvm::Error)>::operator()(in_R9,&local_68);
    if ((long *)((ulong)local_68.Payload & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_68.Payload & 0xfffffffffffffffe) + 8))();
    }
    local_42 = 5;
    *(undefined1 *)OffsetPtr = 0;
  }
  else {
    *(undefined1 *)OffsetPtr = 0;
    local_42 = uVar4;
    if (uVar4 < 5) {
      *(ushort *)((long)OffsetPtr + 0x14) = uVar4;
      *(byte *)((long)OffsetPtr + 0x16) = bVar3;
      *(undefined1 *)((long)OffsetPtr + 0x17) = 0;
      if (Data.Section == (DWARFSection *)0x0) {
        uVar10 = 0;
      }
      else {
        uVar10 = (uint)((Data.Section)->Data).Length;
      }
      *(uint *)(OffsetPtr + 3) = uVar10;
      goto LAB_00d87150;
    }
  }
  uVar4 = local_42;
  uVar8 = DataExtractor::getU32(&Data.super_DataExtractor,offset_ptr,(Error *)0x0);
  *(uint32_t *)(OffsetPtr + 2) = uVar8;
  if (uVar8 == 0xffffffff) {
    *(undefined4 *)(OffsetPtr + 2) = 0;
    pcVar9 = (char *)std::_V2::generic_category();
    pDVar5 = pDStack_40;
    EC_02._M_cat = (error_category *)0x5f;
    EC_02._0_8_ = pDStack_40;
    createStringError<unsigned_long>
              (EC_02,pcVar9,
               (unsigned_long *)"DWARF64 is not supported in .debug_addr at offset 0x%lx");
    return (Error)(ErrorInfoBase *)pDVar5;
  }
  if (uVar8 < 4) {
    uVar10 = uVar8 | 4;
    if (uVar8 == 0) {
      uVar10 = 0;
    }
    local_58 = CONCAT44(local_58._4_4_,uVar10);
    *(undefined4 *)(OffsetPtr + 2) = 0;
    pcVar9 = (char *)std::_V2::generic_category();
    pDVar5 = pDStack_40;
    EC_01._M_cat = (error_category *)0x16;
    EC_01._0_8_ = pDStack_40;
    createStringError<unsigned_long,unsigned_int>
              (EC_01,pcVar9,
               (unsigned_long *)
               ".debug_addr table at offset 0x%lx has too small length (0x%x) to contain a complete header"
               ,(uint *)_TmpLength);
    return (Error)(ErrorInfoBase *)pDVar5;
  }
  uVar2 = *_TmpLength;
  uVar10 = uVar8 + 4;
  if ((uVar2 + uVar10 < uVar2) || (Data.super_DataExtractor.Data.Length <= (uVar2 + uVar10) - 1)) {
    local_58 = CONCAT44(local_58._4_4_,uVar10);
    *(undefined4 *)(OffsetPtr + 2) = 0;
    pcVar9 = (char *)std::_V2::generic_category();
    pDVar5 = pDStack_40;
    EC_06._M_cat = (error_category *)0x16;
    EC_06._0_8_ = pDStack_40;
    createStringError<unsigned_int,unsigned_long>
              (EC_06,pcVar9,
               (uint *)
               "section is not large enough to contain a .debug_addr table of length 0x%x at offset 0x%lx"
               ,&local_58);
    return (Error)(ErrorInfoBase *)pDVar5;
  }
  uVar7 = DataExtractor::getU16(&Data.super_DataExtractor,offset_ptr,(Error *)0x0);
  local_60 = (unsigned_long *)((long)OffsetPtr + 0x14);
  *(uint16_t *)((long)OffsetPtr + 0x14) = uVar7;
  uVar6 = DataExtractor::getU8(&Data.super_DataExtractor,offset_ptr,(Error *)0x0);
  *(uint8_t *)((long)OffsetPtr + 0x16) = uVar6;
  uVar6 = DataExtractor::getU8(&Data.super_DataExtractor,offset_ptr,(Error *)0x0);
  *(uint8_t *)((long)OffsetPtr + 0x17) = uVar6;
  uVar10 = getDataSize((DWARFDebugAddrTable *)OffsetPtr);
  Vals_2 = local_60;
  *(uint *)(OffsetPtr + 3) = uVar10;
  if (5 < *(ushort *)((long)OffsetPtr + 0x14)) {
    pcVar9 = (char *)std::_V2::generic_category();
    pDVar5 = pDStack_40;
    EC_03._M_cat = (error_category *)0x5f;
    EC_03._0_8_ = pDStack_40;
    createStringError<unsigned_short,unsigned_long>
              (EC_03,pcVar9,
               (unsigned_short *)
               "version %u of .debug_addr section at offset 0x%lx is not supported",local_60);
    return (Error)(ErrorInfoBase *)pDVar5;
  }
  if (*(ushort *)((long)OffsetPtr + 0x14) != uVar4) {
    pcVar9 = (char *)std::_V2::generic_category();
    pDVar5 = pDStack_40;
    EC_07._M_cat = (error_category *)0x16;
    EC_07._0_8_ = pDStack_40;
    createStringError<unsigned_long,unsigned_short,unsigned_short>
              (EC_07,pcVar9,
               (unsigned_long *)
               ".debug_addr table at offset 0x%lx has version %u which is different from the version suggested by the DWARF unit header: %u"
               ,(unsigned_short *)_TmpLength,(unsigned_short *)Vals_2);
    return (Error)(ErrorInfoBase *)pDVar5;
  }
LAB_00d87150:
  bVar1 = *(byte *)((long)OffsetPtr + 0x16);
  if ((bVar1 == 4) || (bVar1 == 8)) {
    if (bVar3 != 0 && bVar1 != bVar3) {
      pcVar9 = (char *)std::_V2::generic_category();
      pDVar5 = pDStack_40;
      EC_04._M_cat = (error_category *)0x16;
      EC_04._0_8_ = pDStack_40;
      createStringError<unsigned_long,unsigned_char,unsigned_char>
                (EC_04,pcVar9,
                 (unsigned_long *)
                 ".debug_addr table at offset 0x%lx has address size %u which is different from CU address size %u"
                 ,(uchar *)_TmpLength,(uchar *)((long)OffsetPtr + 0x16));
      return (Error)(ErrorInfoBase *)pDVar5;
    }
    if (*(char *)((long)OffsetPtr + 0x17) == '\0') {
      uVar11 = 0;
      if (uVar10 % (uint)bVar1 != 0) {
        *(undefined4 *)(OffsetPtr + 2) = 0;
        pcVar9 = (char *)std::_V2::generic_category();
        pDVar5 = pDStack_40;
        EC_08._M_cat = (error_category *)0x16;
        EC_08._0_8_ = pDStack_40;
        createStringError<unsigned_long,unsigned_int,unsigned_char>
                  (EC_08,pcVar9,
                   (unsigned_long *)
                   ".debug_addr table at offset 0x%lx contains data of size %u which is not a multiple of addr size %u"
                   ,(uint *)_TmpLength,(uchar *)(OffsetPtr + 3));
        return (Error)(ErrorInfoBase *)pDVar5;
      }
      Data.super_DataExtractor.AddressSize = bVar1;
      for (; uVar11 < uVar10 / bVar1; uVar11 = uVar11 + 1) {
        if (*(uchar *)((long)OffsetPtr + 0x16) == '\x04') {
          uVar8 = DataExtractor::getU32(&Data.super_DataExtractor,offset_ptr,(Error *)0x0);
          local_58 = (ulong)uVar8;
        }
        else {
          local_58 = DataExtractor::getU64(&Data.super_DataExtractor,offset_ptr,(Error *)0x0);
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(OffsetPtr + 4),
                   &local_58);
      }
      *(_func_int ***)pDStack_40 = (_func_int **)0x1;
      return (Error)(ErrorInfoBase *)pDStack_40;
    }
    pcVar9 = (char *)std::_V2::generic_category();
    Vals = ".debug_addr table at offset 0x%lx has unsupported segment selector size %u";
  }
  else {
    pcVar9 = (char *)std::_V2::generic_category();
    Vals = ".debug_addr table at offset 0x%lx has unsupported address size %u";
  }
  pDVar5 = pDStack_40;
  EC_05._M_cat = (error_category *)0x5f;
  EC_05._0_8_ = pDStack_40;
  createStringError<unsigned_long,unsigned_char>
            (EC_05,pcVar9,(unsigned_long *)Vals,(uchar *)_TmpLength);
  return (Error)(ErrorInfoBase *)pDVar5;
}

Assistant:

Error DWARFDebugAddrTable::extract(DWARFDataExtractor Data,
                                   uint64_t *OffsetPtr,
                                   uint16_t Version,
                                   uint8_t AddrSize,
                                   std::function<void(Error)> WarnCallback) {
  clear();
  HeaderOffset = *OffsetPtr;
  // Read and verify the length field.
  if (!Data.isValidOffsetForDataOfSize(*OffsetPtr, sizeof(uint32_t)))
    return createStringError(errc::invalid_argument,
                       "section is not large enough to contain a "
                       ".debug_addr table length at offset 0x%"
                       PRIx64, *OffsetPtr);
  uint16_t UnitVersion;
  if (Version == 0) {
    WarnCallback(createStringError(errc::invalid_argument,
                       "DWARF version is not defined in CU,"
                       " assuming version 5"));
    UnitVersion = 5;
  } else {
    UnitVersion = Version;
  }
  // TODO: Add support for DWARF64.
  Format = dwarf::DwarfFormat::DWARF32;
  if (UnitVersion >= 5) {
    HeaderData.Length = Data.getU32(OffsetPtr);
    if (HeaderData.Length == dwarf::DW_LENGTH_DWARF64) {
      invalidateLength();
      return createStringError(errc::not_supported,
          "DWARF64 is not supported in .debug_addr at offset 0x%" PRIx64,
          HeaderOffset);
    }
    if (HeaderData.Length + sizeof(uint32_t) < sizeof(Header)) {
      uint32_t TmpLength = getLength();
      invalidateLength();
      return createStringError(errc::invalid_argument,
                         ".debug_addr table at offset 0x%" PRIx64
                         " has too small length (0x%" PRIx32
                         ") to contain a complete header",
                         HeaderOffset, TmpLength);
    }
    uint64_t End = HeaderOffset + getLength();
    if (!Data.isValidOffsetForDataOfSize(HeaderOffset, End - HeaderOffset)) {
      uint32_t TmpLength = getLength();
      invalidateLength();
      return createStringError(errc::invalid_argument,
          "section is not large enough to contain a .debug_addr table "
          "of length 0x%" PRIx32 " at offset 0x%" PRIx64,
          TmpLength, HeaderOffset);
    }

    HeaderData.Version = Data.getU16(OffsetPtr);
    HeaderData.AddrSize = Data.getU8(OffsetPtr);
    HeaderData.SegSize = Data.getU8(OffsetPtr);
    DataSize = getDataSize();
  } else {
    HeaderData.Version = UnitVersion;
    HeaderData.AddrSize = AddrSize;
    // TODO: Support for non-zero SegSize.
    HeaderData.SegSize = 0;
    DataSize = Data.size();
  }

  // Perform basic validation of the remaining header fields.

  // We support DWARF version 5 for now as well as pre-DWARF5
  // implementations of .debug_addr table, which doesn't contain a header
  // and consists only of a series of addresses.
  if (HeaderData.Version > 5) {
    return createStringError(errc::not_supported, "version %" PRIu16
        " of .debug_addr section at offset 0x%" PRIx64 " is not supported",
        HeaderData.Version, HeaderOffset);
  }
  // FIXME: For now we just treat version mismatch as an error,
  // however the correct way to associate a .debug_addr table
  // with a .debug_info table is to look at the DW_AT_addr_base
  // attribute in the info table.
  if (HeaderData.Version != UnitVersion)
    return createStringError(errc::invalid_argument,
                       ".debug_addr table at offset 0x%" PRIx64
                       " has version %" PRIu16
                       " which is different from the version suggested"
                       " by the DWARF unit header: %" PRIu16,
                       HeaderOffset, HeaderData.Version, UnitVersion);
  if (HeaderData.AddrSize != 4 && HeaderData.AddrSize != 8)
    return createStringError(errc::not_supported,
                       ".debug_addr table at offset 0x%" PRIx64
                       " has unsupported address size %" PRIu8,
                       HeaderOffset, HeaderData.AddrSize);
  if (HeaderData.AddrSize != AddrSize && AddrSize != 0)
    return createStringError(errc::invalid_argument,
                       ".debug_addr table at offset 0x%" PRIx64
                       " has address size %" PRIu8
                       " which is different from CU address size %" PRIu8,
                       HeaderOffset, HeaderData.AddrSize, AddrSize);

  // TODO: add support for non-zero segment selector size.
  if (HeaderData.SegSize != 0)
    return createStringError(errc::not_supported,
                       ".debug_addr table at offset 0x%" PRIx64
                       " has unsupported segment selector size %" PRIu8,
                       HeaderOffset, HeaderData.SegSize);
  if (DataSize % HeaderData.AddrSize != 0) {
    invalidateLength();
    return createStringError(errc::invalid_argument,
                       ".debug_addr table at offset 0x%" PRIx64
                       " contains data of size %" PRIu32
                       " which is not a multiple of addr size %" PRIu8,
                       HeaderOffset, DataSize, HeaderData.AddrSize);
  }
  Data.setAddressSize(HeaderData.AddrSize);
  uint32_t AddrCount = DataSize / HeaderData.AddrSize;
  for (uint32_t I = 0; I < AddrCount; ++I)
    if (HeaderData.AddrSize == 4)
      Addrs.push_back(Data.getU32(OffsetPtr));
    else
      Addrs.push_back(Data.getU64(OffsetPtr));
  return Error::success();
}